

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O1

void __thiscall
LinkageUntangler::select_linear_anchors
          (LinkageUntangler *this,int min_links,int min_transitive_links)

{
  ulong *puVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer pNVar4;
  long lVar5;
  DistanceGraph *this_00;
  ulong uVar6;
  difference_type __n;
  ulong n;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> fw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> bw_sorted;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_60;
  vector<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_> local_48;
  
  this_00 = *(DistanceGraph **)this;
  pNVar4 = (this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) *
                 0x6db6db6db6db6db7)) {
    n = 1;
    do {
      if (pNVar4[n].status != Deleted) {
        DistanceGraph::fw_neighbours_by_distance(&local_60,this_00,n,min_links);
        bVar2 = true;
        if (0x10 < (ulong)((long)local_60.
                                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_60.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          uVar6 = 0xffffffffffffffff;
          lVar5 = 0x18;
          do {
            uVar6 = uVar6 + 1;
            if (((long)local_60.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar6)
            goto LAB_001b92ad;
            uVar3 = DistanceGraph::link_count
                              (*(DistanceGraph **)this,
                               -*(long *)((long)&local_60.
                                                 super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].first
                                         + lVar5),
                               *(sgNodeID_t *)
                                ((long)&(local_60.
                                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar5))
            ;
            lVar5 = lVar5 + 0x10;
          } while ((uint)min_transitive_links <= uVar3);
          bVar2 = false;
        }
LAB_001b92ad:
        if (bVar2) {
          DistanceGraph::fw_neighbours_by_distance(&local_48,*(DistanceGraph **)this,-n,min_links);
          if (0x10 < (ulong)((long)local_48.
                                   super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            uVar6 = 0xffffffffffffffff;
            lVar5 = 0x18;
            do {
              uVar6 = uVar6 + 1;
              if (((long)local_48.
                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.
                         super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar6)
              goto LAB_001b9332;
              uVar3 = DistanceGraph::link_count
                                (*(DistanceGraph **)this,
                                 -*(long *)((long)&local_48.
                                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[-1].
                                                  first + lVar5),
                                 *(sgNodeID_t *)
                                  ((long)&(local_48.
                                           super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first + lVar5
                                  ));
              lVar5 = lVar5 + 0x10;
            } while ((uint)min_transitive_links <= uVar3);
            bVar2 = false;
          }
LAB_001b9332:
          if (local_60.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_60.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start &&
              local_48.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_48.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            bVar2 = false;
          }
          if (local_48.
              super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (bVar2) {
          puVar1 = (ulong *)(*(long *)(this + 8) + (n >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)n & 0x3f);
        }
        if (local_60.
            super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<std::pair<int,_long>,_std::allocator<std::pair<int,_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      n = n + 1;
      this_00 = *(DistanceGraph **)this;
      pNVar4 = (this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(this_00->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pNVar4 >> 3) * 0x6db6db6db6db6db7;
    } while (n <= uVar6 && uVar6 - n != 0);
  }
  return;
}

Assistant:

void LinkageUntangler::select_linear_anchors(int min_links, int min_transitive_links) {
    for (auto n=1;n<dg.sdg.nodes.size();++n){
        if (dg.sdg.nodes[n].status == NodeStatus::Deleted) continue;
        bool anchor=true;
        auto fw_sorted=dg.fw_neighbours_by_distance(n,min_links);
        if (fw_sorted.size()>1) {
            for (auto i = 0; i < fw_sorted.size() - 1; ++i) {
                if (dg.link_count(-fw_sorted[i].second, fw_sorted[i + 1].second) < min_transitive_links) {
                    anchor = false;
                    break;
                }
            }
        }
        if (anchor) {
            auto bw_sorted = dg.fw_neighbours_by_distance(-n, min_links);
            if (bw_sorted.size()>1) {
                for (auto i = 0; i < bw_sorted.size() - 1; ++i) {
                    if (dg.link_count(-bw_sorted[i].second, bw_sorted[i + 1].second) < min_transitive_links) {
                        anchor = false;
                        break;
                    }
                }
            }
            if (bw_sorted.empty() and fw_sorted.empty()) anchor=false;
        }
        if (anchor) {
                selected_nodes[n] = true;
        }
    }
}